

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall
Arithmetic_Subexpression_Test::~Arithmetic_Subexpression_Test(Arithmetic_Subexpression_Test *this)

{
  Arithmetic_Subexpression_Test *this_local;
  
  ~Arithmetic_Subexpression_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arithmetic, Subexpression) {
	MockParser mock(
		"let a = 3\n"
		"let b = 4\n"
		"let c = 5\n"
		"let d = (a + b) * c\n"
		"let e = (a + b) * (c + d)\n"
		"let f = a * (a + b * c)\n"
		"let g = c * (a + b)\n"
		"let h = a * (b + c * (d + e))"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);
	INS2(BC_SET_N, 2, 2);

	INS(BC_ADD_LL, 3, 0, 1);
	INS(BC_MUL_LL, 3, 3, 2);

	INS(BC_ADD_LL, 4, 0, 1);
	INS(BC_ADD_LL, 5, 2, 3);
	INS(BC_MUL_LL, 4, 4, 5);

	INS(BC_MUL_LL, 5, 1, 2);
	INS(BC_ADD_LL, 5, 0, 5);
	INS(BC_MUL_LL, 5, 0, 5);

	INS(BC_ADD_LL, 6, 0, 1);
	INS(BC_MUL_LL, 6, 2, 6);

	INS(BC_ADD_LL, 7, 3, 4);
	INS(BC_MUL_LL, 7, 2, 7);
	INS(BC_ADD_LL, 7, 1, 7);
	INS(BC_MUL_LL, 7, 0, 7);

	INS(BC_RET, 0, 0, 0);
}